

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

char * Curl_copy_header_value(char *header)

{
  int iVar1;
  bool bVar2;
  size_t len;
  char *value;
  char *end;
  char *start;
  char *header_local;
  
  start = header;
  while( true ) {
    bVar2 = false;
    if (*start != '\0') {
      bVar2 = *start != ':';
    }
    if (!bVar2) break;
    start = start + 1;
  }
  if (*start != '\0') {
    start = start + 1;
  }
  end = start;
  while( true ) {
    bVar2 = false;
    if (*end != '\0') {
      iVar1 = Curl_isspace((uint)(byte)*end);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    end = end + 1;
  }
  value = strchr(end,0xd);
  if (value == (char *)0x0) {
    value = strchr(end,10);
  }
  if (value == (char *)0x0) {
    value = strchr(end,0);
  }
  if (value == (char *)0x0) {
    header_local = (char *)0x0;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (end < value) {
        iVar1 = Curl_isspace((uint)(byte)*value);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      value = value + -1;
    }
    header_local = (char *)(*Curl_cmalloc)((size_t)(value + (2 - (long)end)));
    if (header_local == (char *)0x0) {
      header_local = (char *)0x0;
    }
    else {
      memcpy(header_local,end,(size_t)(value + (1 - (long)end)));
      header_local[(long)(value + (1 - (long)end))] = '\0';
    }
  }
  return header_local;
}

Assistant:

char *Curl_copy_header_value(const char *header)
{
  const char *start;
  const char *end;
  char *value;
  size_t len;

  /* Find the end of the header name */
  while(*header && (*header != ':'))
    ++header;

  if(*header)
    /* Skip over colon */
    ++header;

  /* Find the first non-space letter */
  start = header;
  while(*start && ISSPACE(*start))
    start++;

  /* data is in the host encoding so
     use '\r' and '\n' instead of 0x0d and 0x0a */
  end = strchr(start, '\r');
  if(!end)
    end = strchr(start, '\n');
  if(!end)
    end = strchr(start, '\0');
  if(!end)
    return NULL;

  /* skip all trailing space letters */
  while((end > start) && ISSPACE(*end))
    end--;

  /* get length of the type */
  len = end - start + 1;

  value = malloc(len + 1);
  if(!value)
    return NULL;

  memcpy(value, start, len);
  value[len] = 0; /* null-terminate */

  return value;
}